

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-opcnt.cc
# Opt level: O2

void __thiscall wabt::OpcodeInfo::Write(OpcodeInfo *this,Stream *stream)

{
  uint uVar1;
  Index IVar2;
  char *pcVar3;
  double *pdVar4;
  unsigned_long *puVar5;
  float *pfVar6;
  uint *puVar7;
  Type *pTVar8;
  char *pcVar9;
  size_t i;
  unsigned_long uVar10;
  pair<const_unsigned_int_*,_unsigned_long> pVar11;
  char buffer [41];
  
  pcVar9 = buffer;
  pcVar3 = Opcode::GetName(&this->opcode_);
  Stream::Writef(stream,"%s",pcVar3);
  switch(this->kind_) {
  case Uint32:
    puVar7 = GetData<unsigned_int>(this,1);
    uVar1 = *puVar7;
    puVar7 = GetData<unsigned_int>(this,1);
    Stream::Writef(stream," %u (0x%x)",(ulong)uVar1,(ulong)*puVar7);
    return;
  case Uint64:
    puVar5 = GetData<unsigned_long>(this,1);
    uVar10 = *puVar5;
    puVar5 = GetData<unsigned_long>(this,1);
    Stream::Writef(stream," %lu (0x%lx)",uVar10,*puVar5);
    return;
  case Index:
    puVar7 = GetData<unsigned_int>(this,1);
    Stream::Writef(stream," %u",(ulong)*puVar7);
    return;
  case Float32:
    pfVar6 = GetData<float>(this,1);
    Stream::Writef(stream," %g",(double)*pfVar6);
    puVar7 = GetData<unsigned_int>(this,1);
    WriteFloatHex(buffer,0x15,*puVar7);
    goto LAB_0012b1be;
  case Float64:
    pdVar4 = GetData<double>(this,1);
    Stream::Writef(stream," %g",*pdVar4);
    puVar5 = GetData<unsigned_long>(this,1);
    WriteDoubleHex(buffer,0x29,*puVar5);
LAB_0012b1be:
    pcVar3 = " (%s)";
LAB_0012b1cb:
    Stream::Writef(stream,pcVar3,pcVar9);
    break;
  case Uint32Uint32:
    pVar11 = GetDataArray<unsigned_int>(this);
    for (uVar10 = 0; pVar11.second != uVar10; uVar10 = uVar10 + 1) {
      pcVar3 = ", ";
      if (uVar10 == 0) {
        pcVar3 = " ";
      }
      Stream::Writef(stream,"%s",pcVar3);
      Stream::Writef(stream,"%u",(ulong)pVar11.first[uVar10]);
    }
    break;
  case BlockSig:
    pTVar8 = GetData<wabt::Type>(this,1);
    buffer._0_4_ = pTVar8->enum_;
    if (I32 < (int)buffer._0_4_) {
      IVar2 = Type::GetIndex((Type *)buffer);
      Stream::Writef(stream," type:%d",(ulong)IVar2);
      return;
    }
    if (buffer._0_4_ == Void) {
      return;
    }
    pcVar9 = Type::GetName((Type *)buffer);
    pcVar3 = " %s";
    goto LAB_0012b1cb;
  case BrTable:
    pVar11 = GetDataArray<unsigned_int>(this);
    for (uVar10 = 0; pVar11.second != uVar10; uVar10 = uVar10 + 1) {
      pcVar3 = ", ";
      if (uVar10 == 0) {
        pcVar3 = " ";
      }
      Stream::Writef(stream,"%s",pcVar3);
      Stream::Writef(stream,"%u",(ulong)pVar11.first[uVar10]);
    }
  }
  return;
}

Assistant:

void OpcodeInfo::Write(Stream& stream) {
  stream.Writef("%s", opcode_.GetName());

  switch (kind_) {
    case Kind::Bare:
      break;

    case Kind::Uint32:
      stream.Writef(" %u (0x%x)", *GetData<uint32_t>(), *GetData<uint32_t>());
      break;

    case Kind::Uint64:
      stream.Writef(" %" PRIu64 " (0x%" PRIx64 ")", *GetData<uint64_t>(),
                    *GetData<uint64_t>());
      break;

    case Kind::Index:
      stream.Writef(" %" PRIindex, *GetData<Index>());
      break;

    case Kind::Float32: {
      stream.Writef(" %g", *GetData<float>());
      char buffer[WABT_MAX_FLOAT_HEX + 1];
      WriteFloatHex(buffer, sizeof(buffer), *GetData<uint32_t>());
      stream.Writef(" (%s)", buffer);
      break;
    }

    case Kind::Float64: {
      stream.Writef(" %g", *GetData<double>());
      char buffer[WABT_MAX_DOUBLE_HEX + 1];
      WriteDoubleHex(buffer, sizeof(buffer), *GetData<uint64_t>());
      stream.Writef(" (%s)", buffer);
      break;
    }

    case Kind::Uint32Uint32:
      WriteArray<uint32_t>(
          stream, [&stream](uint32_t value) { stream.Writef("%u", value); });
      break;

    case Kind::BlockSig: {
      auto type = *GetData<Type>();
      if (type.IsIndex()) {
        stream.Writef(" type:%d", type.GetIndex());
      } else if (type != Type::Void) {
        stream.Writef(" %s", type.GetName());
      }
      break;
    }

    case Kind::BrTable: {
      WriteArray<Index>(stream, [&stream](Index index) {
        stream.Writef("%" PRIindex, index);
      });
      break;
    }
  }
}